

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O0

void rw::conv_RGBA8888_from_ARGB1555(uint8 *out,uint8 *in)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint32 a;
  uint32 b;
  uint32 g;
  uint32 r;
  uint8 *in_local;
  uint8 *out_local;
  
  bVar1 = in[1];
  bVar2 = in[1];
  bVar3 = *in;
  bVar4 = *in;
  *out = (uint8)((ulong)(((int)(uint)in[1] >> 2 & 0x1fU) * 0xff) / 0x1f);
  out[1] = (uint8)((ulong)(((bVar2 & 3) << 3 | (int)(uint)bVar3 >> 5) * 0xff) / 0x1f);
  out[2] = (uint8)((ulong)((bVar4 & 0x1f) * 0xff) / 0x1f);
  out[3] = -(char)((int)(uint)bVar1 >> 7);
  return;
}

Assistant:

void
conv_RGBA8888_from_ARGB1555(uint8 *out, uint8 *in)
{
	uint32 r, g, b, a;
	a = (in[1]>>7) & 1;
	r = (in[1]>>2) & 0x1F;
	g = (in[1]&3)<<3 | ((in[0]>>5)&7);
	b = in[0] & 0x1F;
	out[0] = r*0xFF/0x1f;
	out[1] = g*0xFF/0x1f;
	out[2] = b*0xFF/0x1f;
	out[3] = a*0xFF;
}